

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O1

uint64_t arena_decay_compute_purge_interval_impl
                   (tsdn_t *tsdn,arena_decay_t *decay,extents_t *extents)

{
  pthread_mutex_t *__mutex;
  witness_t **ppwVar1;
  undefined1 auVar2 [16];
  int iVar3;
  uint64_t sum;
  uint64_t uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint64_t *puVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  mutex_prof_data_t *data;
  long lVar16;
  long lVar17;
  
  __mutex = (pthread_mutex_t *)((long)&(decay->mtx).field_0 + 0x40);
  iVar3 = pthread_mutex_trylock(__mutex);
  if (iVar3 == 0) {
    puVar10 = &(decay->mtx).field_0.field_0.prof_data.n_lock_ops;
    *puVar10 = *puVar10 + 1;
    if ((decay->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
      (decay->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
      ppwVar1 = &(decay->mtx).field_0.witness.link.qre_prev;
      *ppwVar1 = (witness_t *)((long)&(*ppwVar1)->name + 1);
    }
  }
  else {
    (decay->mtx).field_0.field_0.locked.repr = true;
  }
  if (iVar3 != 0) {
    return 100000000;
  }
  uVar6 = 0xffffffffffffffff;
  if (0 < (decay->time_ms).repr) {
    uVar4 = nstime_ns(&decay->interval);
    sVar5 = extents_npages_get(extents);
    if (sVar5 == 0) {
      lVar8 = 0;
      do {
        if (decay->backlog[lVar8] != 0) goto LAB_0011b21a;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 200);
      lVar8 = 200;
LAB_0011b21a:
      if ((int)lVar8 == 200) goto LAB_0011b440;
    }
    if (sVar5 < 0x401) {
      uVar6 = uVar4 * 200;
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar4;
      uVar6 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(100000000)) / auVar2,0);
      uVar9 = 2;
      if (2 < uVar6) {
        uVar9 = uVar6;
      }
      uVar6 = 100000000;
      if (0x7aaf0 < uVar4 && 100000000 < uVar4 * 200) {
        uVar7 = 0;
        uVar6 = 0;
        do {
          uVar7 = uVar7 + h_steps[uVar6] * decay->backlog[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar9 != uVar6);
        if (500000 < uVar4) {
          puVar10 = h_steps;
          uVar6 = uVar9;
          do {
            uVar7 = uVar7 + (h_steps[uVar6] - *puVar10) * decay->backlog[uVar6];
            uVar6 = uVar6 + 1;
            puVar10 = puVar10 + 1;
          } while (uVar6 != 200);
        }
        uVar7 = uVar7 >> 0x18;
        if (uVar7 < 0x401) {
          lVar16 = 0;
          lVar17 = 0;
          lVar8 = 0;
          do {
            uVar6 = decay->backlog[lVar8];
            uVar11 = (decay->backlog + lVar8)[1];
            uVar12 = h_steps[lVar8];
            uVar13 = h_steps[lVar8 + 1];
            lVar16 = lVar16 + (uVar12 & 0xffffffff) * (uVar6 & 0xffffffff) +
                     ((uVar6 >> 0x20) * (uVar12 & 0xffffffff) +
                      (uVar12 >> 0x20) * (uVar6 & 0xffffffff) << 0x20);
            lVar17 = lVar17 + (uVar13 & 0xffffffff) * (uVar11 & 0xffffffff) +
                     ((uVar11 >> 0x20) * (uVar13 & 0xffffffff) +
                      (uVar13 >> 0x20) * (uVar11 & 0xffffffff) << 0x20);
            lVar8 = lVar8 + 2;
          } while (lVar8 != 200);
          uVar6 = uVar4 * 200;
          if (0x3ffffffff < (ulong)(lVar17 + lVar16)) {
            uVar11 = (ulong)(lVar17 + lVar16) >> 0x18;
            uVar6 = 200;
            if (0x7b4da < uVar4 && uVar7 + 0x400 < uVar11) {
              do {
                uVar12 = uVar6 + uVar9 >> 1;
                if (uVar6 + uVar9 < 2) {
                  uVar13 = 0;
                  uVar15 = 0;
                }
                else {
                  uVar13 = 0;
                  uVar14 = 0;
                  do {
                    uVar13 = uVar13 + h_steps[uVar14] * decay->backlog[uVar14];
                    uVar14 = uVar14 + 1;
                    uVar15 = uVar12;
                  } while (uVar12 != uVar14);
                }
                if (uVar15 < 200) {
                  do {
                    uVar13 = uVar13 + (h_steps[uVar15] - h_steps[uVar15 - uVar12]) *
                                      decay->backlog[uVar15];
                    uVar15 = uVar15 + 1;
                  } while (uVar15 != 200);
                }
                uVar14 = uVar13 >> 0x18;
                if (0x400ffffff < uVar13) {
                  uVar11 = uVar13 >> 0x18;
                  uVar6 = uVar12;
                  uVar12 = uVar9;
                  uVar14 = uVar7;
                }
                uVar7 = uVar14;
                uVar9 = uVar12;
              } while ((uVar7 + 0x400 < uVar11) && (uVar9 + 2 < uVar6));
            }
            uVar6 = (uVar9 + uVar6) * uVar4 >> 1;
          }
        }
        else {
          uVar6 = uVar9 * uVar4;
        }
      }
    }
  }
LAB_0011b440:
  uVar4 = 100000000;
  if (100000000 < uVar6) {
    uVar4 = uVar6;
  }
  (decay->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  return uVar4;
}

Assistant:

static uint64_t
arena_decay_compute_purge_interval_impl(tsdn_t *tsdn, arena_decay_t *decay,
    extents_t *extents) {
	if (malloc_mutex_trylock(tsdn, &decay->mtx)) {
		/* Use minimal interval if decay is contended. */
		return BACKGROUND_THREAD_MIN_INTERVAL_NS;
	}

	uint64_t interval;
	ssize_t decay_time = atomic_load_zd(&decay->time_ms, ATOMIC_RELAXED);
	if (decay_time <= 0) {
		/* Purging is eagerly done or disabled currently. */
		interval = BACKGROUND_THREAD_INDEFINITE_SLEEP;
		goto label_done;
	}

	uint64_t decay_interval_ns = nstime_ns(&decay->interval);
	assert(decay_interval_ns > 0);
	size_t npages = extents_npages_get(extents);
	if (npages == 0) {
		unsigned i;
		for (i = 0; i < SMOOTHSTEP_NSTEPS; i++) {
			if (decay->backlog[i] > 0) {
				break;
			}
		}
		if (i == SMOOTHSTEP_NSTEPS) {
			/* No dirty pages recorded.  Sleep indefinitely. */
			interval = BACKGROUND_THREAD_INDEFINITE_SLEEP;
			goto label_done;
		}
	}
	if (npages <= BACKGROUND_THREAD_NPAGES_THRESHOLD) {
		/* Use max interval. */
		interval = decay_interval_ns * SMOOTHSTEP_NSTEPS;
		goto label_done;
	}

	size_t lb = BACKGROUND_THREAD_MIN_INTERVAL_NS / decay_interval_ns;
	size_t ub = SMOOTHSTEP_NSTEPS;
	/* Minimal 2 intervals to ensure reaching next epoch deadline. */
	lb = (lb < 2) ? 2 : lb;
	if ((decay_interval_ns * ub <= BACKGROUND_THREAD_MIN_INTERVAL_NS) ||
	    (lb + 2 > ub)) {
		interval = BACKGROUND_THREAD_MIN_INTERVAL_NS;
		goto label_done;
	}

	assert(lb + 2 <= ub);
	size_t npurge_lb, npurge_ub;
	npurge_lb = decay_npurge_after_interval(decay, lb);
	if (npurge_lb > BACKGROUND_THREAD_NPAGES_THRESHOLD) {
		interval = decay_interval_ns * lb;
		goto label_done;
	}
	npurge_ub = decay_npurge_after_interval(decay, ub);
	if (npurge_ub < BACKGROUND_THREAD_NPAGES_THRESHOLD) {
		interval = decay_interval_ns * ub;
		goto label_done;
	}

	unsigned n_search = 0;
	size_t target, npurge;
	while ((npurge_lb + BACKGROUND_THREAD_NPAGES_THRESHOLD < npurge_ub)
	    && (lb + 2 < ub)) {
		target = (lb + ub) / 2;
		npurge = decay_npurge_after_interval(decay, target);
		if (npurge > BACKGROUND_THREAD_NPAGES_THRESHOLD) {
			ub = target;
			npurge_ub = npurge;
		} else {
			lb = target;
			npurge_lb = npurge;
		}
		assert(n_search++ < lg_floor(SMOOTHSTEP_NSTEPS) + 1);
	}
	interval = decay_interval_ns * (ub + lb) / 2;
label_done:
	interval = (interval < BACKGROUND_THREAD_MIN_INTERVAL_NS) ?
	    BACKGROUND_THREAD_MIN_INTERVAL_NS : interval;
	malloc_mutex_unlock(tsdn, &decay->mtx);

	return interval;
}